

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_readCTable(HUF_CElt *CTable,U32 *maxSymbolValuePtr,void *src,size_t srcSize)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  uint uVar4;
  int *in_RSI;
  long in_RDI;
  U32 n_4;
  U32 n_3;
  U16 min;
  U32 n_2;
  U16 valPerRank [14];
  U16 nbPerRank [14];
  U32 w;
  U32 n_1;
  U32 current;
  U32 nextRankStart;
  U32 n;
  size_t readSize;
  U32 nbSymbols;
  U32 tableLog;
  U32 rankVal [16];
  BYTE huffWeight [256];
  uint local_1d8;
  uint local_1d4;
  short local_1ce;
  uint local_1cc;
  short local_1c8 [16];
  short local_1a8 [14];
  uint local_18c;
  uint local_188;
  int local_184;
  int local_180;
  uint local_17c;
  size_t local_178;
  uint local_170;
  uint local_16c;
  int local_168 [16];
  byte local_128 [136];
  void *in_stack_ffffffffffffff60;
  U32 *in_stack_ffffffffffffff68;
  U32 *in_stack_ffffffffffffff70;
  U32 *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  BYTE *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffffa0;
  size_t local_8;
  
  local_16c = 0;
  local_170 = 0;
  local_178 = HUF_readStats(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                            in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                            in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                            in_stack_ffffffffffffffa0);
  uVar4 = ERR_isError(local_178);
  if (uVar4 == 0) {
    if (local_16c < 0xd) {
      if (*in_RSI + 1U < local_170) {
        local_8 = 0xfffffffffffffff9;
      }
      else {
        local_180 = 0;
        for (local_17c = 1; iVar3 = local_180, local_17c <= local_16c; local_17c = local_17c + 1) {
          local_184 = local_180;
          local_180 = (local_168[local_17c] << ((char)local_17c - 1U & 0x1f)) + local_180;
          local_168[local_17c] = iVar3;
        }
        for (local_188 = 0; local_188 < local_170; local_188 = local_188 + 1) {
          local_18c = (uint)local_128[local_188];
          *(byte *)(in_RDI + 2 + (ulong)local_188 * 4) =
               ((char)local_16c + '\x01') - local_128[local_188];
        }
        memset(local_1a8,0,0x1c);
        memset(local_1c8,0,0x1c);
        for (local_1cc = 0; local_1cc < local_170; local_1cc = local_1cc + 1) {
          bVar1 = *(byte *)(in_RDI + 2 + (ulong)local_1cc * 4);
          local_1a8[bVar1] = local_1a8[bVar1] + 1;
        }
        local_1c8[local_16c + 1] = 0;
        local_1ce = 0;
        for (local_1d4 = local_16c; local_1d4 != 0; local_1d4 = local_1d4 - 1) {
          local_1c8[local_1d4] = local_1ce;
          local_1ce = (short)((int)(uint)(ushort)(local_1ce + local_1a8[local_1d4]) >> 1);
        }
        for (local_1d8 = 0; local_1d8 < local_170; local_1d8 = local_1d8 + 1) {
          bVar1 = *(byte *)(in_RDI + 2 + (ulong)local_1d8 * 4);
          sVar2 = local_1c8[bVar1];
          local_1c8[bVar1] = sVar2 + 1;
          *(short *)(in_RDI + (ulong)local_1d8 * 4) = sVar2;
        }
        *in_RSI = local_170 - 1;
        local_8 = local_178;
      }
    }
    else {
      local_8 = 0xfffffffffffffffb;
    }
  }
  else {
    local_8 = local_178;
  }
  return local_8;
}

Assistant:

size_t HUF_readCTable (HUF_CElt* CTable, U32* maxSymbolValuePtr, const void* src, size_t srcSize)
{
    BYTE huffWeight[HUF_SYMBOLVALUE_MAX + 1];   /* init not required, even though some static analyzer may complain */
    U32 rankVal[HUF_TABLELOG_ABSOLUTEMAX + 1];   /* large enough for values from 0 to 16 */
    U32 tableLog = 0;
    U32 nbSymbols = 0;

    /* get symbol weights */
    CHECK_V_F(readSize, HUF_readStats(huffWeight, HUF_SYMBOLVALUE_MAX+1, rankVal, &nbSymbols, &tableLog, src, srcSize));

    /* check result */
    if (tableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (nbSymbols > *maxSymbolValuePtr+1) return ERROR(maxSymbolValue_tooSmall);

    /* Prepare base value per rank */
    {   U32 n, nextRankStart = 0;
        for (n=1; n<=tableLog; n++) {
            U32 current = nextRankStart;
            nextRankStart += (rankVal[n] << (n-1));
            rankVal[n] = current;
    }   }

    /* fill nbBits */
    {   U32 n; for (n=0; n<nbSymbols; n++) {
            const U32 w = huffWeight[n];
            CTable[n].nbBits = (BYTE)(tableLog + 1 - w);
    }   }

    /* fill val */
    {   U16 nbPerRank[HUF_TABLELOG_MAX+2]  = {0};  /* support w=0=>n=tableLog+1 */
        U16 valPerRank[HUF_TABLELOG_MAX+2] = {0};
        { U32 n; for (n=0; n<nbSymbols; n++) nbPerRank[CTable[n].nbBits]++; }
        /* determine stating value per rank */
        valPerRank[tableLog+1] = 0;   /* for w==0 */
        {   U16 min = 0;
            U32 n; for (n=tableLog; n>0; n--) {  /* start at n=tablelog <-> w=1 */
                valPerRank[n] = min;     /* get starting value within each rank */
                min += nbPerRank[n];
                min >>= 1;
        }   }
        /* assign value within rank, symbol order */
        { U32 n; for (n=0; n<nbSymbols; n++) CTable[n].val = valPerRank[CTable[n].nbBits]++; }
    }

    *maxSymbolValuePtr = nbSymbols - 1;
    return readSize;
}